

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypeStruct(ValidationState_t *_,Instruction *inst)

{
  ulong uVar1;
  size_t sVar2;
  Instruction *pIVar3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  Op OVar7;
  int32_t iVar8;
  Decoration DVar9;
  int iVar10;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *pvVar11;
  size_type sVar12;
  DiagnosticStream *pDVar13;
  spv_const_context psVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  Instruction *pIVar15;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this_00;
  reference pDVar16;
  size_type sVar17;
  spv_const_validator_options psVar18;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar19;
  bool local_13a9;
  string local_1310;
  string local_12f0;
  DiagnosticStream local_12d0;
  byte local_10f1;
  function<bool_(const_spvtools::val::Instruction_*)> local_10f0;
  anon_class_8_1_54a397ff local_10d0;
  anon_class_8_1_54a397ff isOpaqueType;
  DiagnosticStream local_10c0;
  int local_ee8;
  int local_ee4;
  int num_builtin_members;
  int num_struct_members;
  undefined1 local_ed8;
  value_type local_ecc;
  undefined1 local_ec8 [8];
  Decoration decoration;
  iterator __end2;
  iterator __begin2;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  built_in_members;
  Instruction *memberTypeInstr;
  ulong uStack_c68;
  uint32_t member;
  size_t word_i;
  undefined1 local_c58 [7];
  bool has_nested_blockOrBufferBlock_struct;
  string local_c38;
  DiagnosticStream local_c18;
  string local_a40;
  string local_a20;
  DiagnosticStream local_a00;
  undefined1 local_821;
  undefined1 local_820 [7];
  bool is_last_member;
  string local_800;
  string local_7e0;
  DiagnosticStream local_7c0;
  DiagnosticStream local_5e8;
  string local_410;
  DiagnosticStream local_3f0;
  Instruction *local_218;
  Instruction *member_type;
  uint32_t local_34;
  ulong uStack_30;
  uint member_type_id;
  size_t member_type_index;
  Instruction *pIStack_20;
  uint32_t struct_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  member_type_index._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  uStack_30 = 1;
  while( true ) {
    uVar1 = uStack_30;
    pvVar11 = Instruction::operands(pIStack_20);
    sVar12 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar11)
    ;
    if (sVar12 <= uVar1) break;
    uVar5 = Instruction::GetOperandAs<unsigned_int>(pIStack_20,uStack_30);
    local_34 = uVar5;
    uVar6 = Instruction::id(pIStack_20);
    if (uVar5 == uVar6) {
      ValidationState_t::diag
                ((DiagnosticStream *)&member_type,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar13 = DiagnosticStream::operator<<
                          ((DiagnosticStream *)&member_type,
                           (char (*) [45])"Structure members may not be self references");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&member_type);
      return __local._4_4_;
    }
    local_218 = ValidationState_t::FindDef((ValidationState_t *)inst_local,local_34);
    if (local_218 == (Instruction *)0x0) {
LAB_002f3a39:
      ValidationState_t::diag
                (&local_3f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar13 = DiagnosticStream::operator<<
                          (&local_3f0,(char (*) [31])"OpTypeStruct Member Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_410,(ValidationState_t *)inst_local,local_34);
      pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_410);
      pDVar13 = DiagnosticStream::operator<<(pDVar13,(char (*) [16])" is not a type.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
      std::__cxx11::string::~string((string *)&local_410);
      DiagnosticStream::~DiagnosticStream(&local_3f0);
      return __local._4_4_;
    }
    OVar7 = Instruction::opcode(local_218);
    iVar8 = spvOpcodeGeneratesType(OVar7);
    if (iVar8 == 0) goto LAB_002f3a39;
    OVar7 = Instruction::opcode(local_218);
    if (OVar7 == OpTypeVoid) {
      ValidationState_t::diag
                (&local_5e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar13 = DiagnosticStream::operator<<
                          (&local_5e8,(char (*) [39])"Structures cannot contain a void type.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
      DiagnosticStream::~DiagnosticStream(&local_5e8);
      return __local._4_4_;
    }
    OVar7 = Instruction::opcode(local_218);
    if ((OVar7 == OpTypeStruct) &&
       (bVar4 = ValidationState_t::IsStructTypeWithBuiltInMember
                          ((ValidationState_t *)inst_local,local_34), bVar4)) {
      ValidationState_t::diag
                (&local_7c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar13 = DiagnosticStream::operator<<(&local_7c0,(char (*) [16])0x646b1a);
      ValidationState_t::getIdName_abi_cxx11_(&local_7e0,(ValidationState_t *)inst_local,local_34);
      pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_7e0);
      pDVar13 = DiagnosticStream::operator<<
                          (pDVar13,(char (*) [59])
                                   " contains members with BuiltIn decoration. Therefore this ");
      pDVar13 = DiagnosticStream::operator<<
                          (pDVar13,(char (*) [55])
                                   "structure may not be contained as a member of another ");
      pDVar13 = DiagnosticStream::operator<<(pDVar13,(char (*) [11])"structure ");
      pDVar13 = DiagnosticStream::operator<<(pDVar13,(char (*) [22])"type. Structure <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                (&local_800,(ValidationState_t *)inst_local,member_type_index._4_4_);
      pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_800);
      pDVar13 = DiagnosticStream::operator<<(pDVar13,(char (*) [26])" contains structure <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)local_820,(ValidationState_t *)inst_local,local_34);
      pDVar13 = DiagnosticStream::operator<<
                          (pDVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_820);
      pDVar13 = DiagnosticStream::operator<<(pDVar13,(char (*) [2])0x62c2d7);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
      std::__cxx11::string::~string((string *)local_820);
      std::__cxx11::string::~string((string *)&local_800);
      std::__cxx11::string::~string((string *)&local_7e0);
      DiagnosticStream::~DiagnosticStream(&local_7c0);
      return __local._4_4_;
    }
    psVar14 = ValidationState_t::context((ValidationState_t *)inst_local);
    bVar4 = spvIsVulkanEnv(psVar14->target_env);
    if ((bVar4) &&
       (OVar7 = Instruction::opcode(local_218), sVar2 = uStack_30, OVar7 == OpTypeRuntimeArray)) {
      pvVar11 = Instruction::operands(pIStack_20);
      sVar12 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                         (pvVar11);
      pIVar15 = inst_local;
      local_821 = sVar2 == sVar12 - 1;
      if (!(bool)local_821) {
        ValidationState_t::diag
                  (&local_a00,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_a20,(ValidationState_t *)inst_local,0x1248,(char *)0x0);
        pDVar13 = DiagnosticStream::operator<<(&local_a00,&local_a20);
        pDVar13 = DiagnosticStream::operator<<(pDVar13,(char (*) [4])0x6300a7);
        psVar14 = ValidationState_t::context((ValidationState_t *)inst_local);
        spvLogStringForEnv_abi_cxx11_(&local_a40,psVar14->target_env);
        pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_a40);
        pDVar13 = DiagnosticStream::operator<<
                            (pDVar13,(char (*) [78])
                                     ", OpTypeRuntimeArray must only be used for the last member of an OpTypeStruct"
                            );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
        std::__cxx11::string::~string((string *)&local_a40);
        std::__cxx11::string::~string((string *)&local_a20);
        DiagnosticStream::~DiagnosticStream(&local_a00);
        return __local._4_4_;
      }
      uVar6 = Instruction::id(pIStack_20);
      bVar4 = ValidationState_t::HasDecoration((ValidationState_t *)pIVar15,uVar6,Block);
      pIVar15 = inst_local;
      if (!bVar4) {
        uVar6 = Instruction::id(pIStack_20);
        bVar4 = ValidationState_t::HasDecoration((ValidationState_t *)pIVar15,uVar6,BufferBlock);
        if (!bVar4) {
          ValidationState_t::diag
                    (&local_c18,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
          ValidationState_t::VkErrorID_abi_cxx11_
                    (&local_c38,(ValidationState_t *)inst_local,0x1248,(char *)0x0);
          pDVar13 = DiagnosticStream::operator<<(&local_c18,&local_c38);
          psVar14 = ValidationState_t::context((ValidationState_t *)inst_local);
          spvLogStringForEnv_abi_cxx11_((string *)local_c58,psVar14->target_env);
          pDVar13 = DiagnosticStream::operator<<
                              (pDVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_c58);
          pDVar13 = DiagnosticStream::operator<<
                              (pDVar13,(char (*) [49])
                                       ", OpTypeStruct containing an OpTypeRuntimeArray ");
          pDVar13 = DiagnosticStream::operator<<
                              (pDVar13,(char (*) [45])"must be decorated with Block or BufferBlock."
                              );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
          std::__cxx11::string::~string((string *)local_c58);
          std::__cxx11::string::~string((string *)&local_c38);
          DiagnosticStream::~DiagnosticStream(&local_c18);
          return __local._4_4_;
        }
      }
    }
    uStack_30 = uStack_30 + 1;
  }
  word_i._7_1_ = false;
  uStack_c68 = 2;
  while( true ) {
    this = Instruction::words(pIStack_20);
    sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
    pIVar15 = inst_local;
    if (sVar12 <= uStack_c68) break;
    uVar6 = Instruction::word(pIStack_20,uStack_c68);
    pIVar15 = ValidationState_t::FindDef((ValidationState_t *)inst_local,uVar6);
    if ((pIVar15 != (Instruction *)0x0) &&
       (OVar7 = Instruction::opcode(pIVar15), pIVar3 = inst_local, OVar7 == OpTypeStruct)) {
      uVar6 = Instruction::id(pIVar15);
      bVar4 = ValidationState_t::HasDecoration((ValidationState_t *)pIVar3,uVar6,Block);
      pIVar3 = inst_local;
      if (!bVar4) {
        uVar6 = Instruction::id(pIVar15);
        bVar4 = ValidationState_t::HasDecoration((ValidationState_t *)pIVar3,uVar6,BufferBlock);
        pIVar3 = inst_local;
        if (!bVar4) {
          uVar6 = Instruction::id(pIVar15);
          bVar4 = ValidationState_t::GetHasNestedBlockOrBufferBlockStruct
                            ((ValidationState_t *)pIVar3,uVar6);
          if (!bVar4) goto LAB_002f403e;
        }
      }
      word_i._7_1_ = true;
    }
LAB_002f403e:
    uStack_c68 = uStack_c68 + 1;
  }
  uVar6 = Instruction::id(pIStack_20);
  ValidationState_t::SetHasNestedBlockOrBufferBlockStruct
            ((ValidationState_t *)pIVar15,uVar6,word_i._7_1_);
  pIVar15 = inst_local;
  uVar6 = Instruction::id(pIStack_20);
  bVar4 = ValidationState_t::GetHasNestedBlockOrBufferBlockStruct
                    ((ValidationState_t *)pIVar15,uVar6);
  pIVar15 = inst_local;
  if (bVar4) {
    uVar6 = Instruction::id(pIStack_20);
    bVar4 = ValidationState_t::HasDecoration((ValidationState_t *)pIVar15,uVar6,BufferBlock);
    pIVar15 = inst_local;
    if (!bVar4) {
      uVar6 = Instruction::id(pIStack_20);
      bVar4 = ValidationState_t::HasDecoration((ValidationState_t *)pIVar15,uVar6,Block);
      if (!bVar4) goto LAB_002f414f;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)&built_in_members._M_h._M_single_bucket,
               (ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    pDVar13 = DiagnosticStream::operator<<
                        ((DiagnosticStream *)&built_in_members._M_h._M_single_bucket,
                         (char (*) [85])
                         "rules: A Block or BufferBlock cannot be nested within another Block or BufferBlock. "
                        );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&built_in_members._M_h._M_single_bucket)
    ;
  }
  else {
LAB_002f414f:
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&__range2);
    this_00 = ValidationState_t::id_decorations
                        ((ValidationState_t *)inst_local,member_type_index._4_4_);
    __end2 = std::
             set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
             ::begin(this_00);
    decoration._32_8_ =
         std::
         set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
         ::end(this_00);
    while (bVar4 = std::operator!=(&__end2,(_Self *)&decoration.struct_member_index_), bVar4) {
      pDVar16 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end2);
      Decoration::Decoration((Decoration *)local_ec8,pDVar16);
      DVar9 = Decoration::dec_type((Decoration *)local_ec8);
      if ((DVar9 == BuiltIn) &&
         (iVar10 = Decoration::struct_member_index((Decoration *)local_ec8), iVar10 != -1)) {
        local_ecc = Decoration::struct_member_index((Decoration *)local_ec8);
        pVar19 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&__range2,&local_ecc);
        _num_builtin_members =
             (__node_type *)pVar19.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_ed8 = pVar19.second;
      }
      Decoration::~Decoration((Decoration *)local_ec8);
      std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end2);
    }
    pvVar11 = Instruction::operands(pIStack_20);
    sVar12 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(pvVar11)
    ;
    local_ee4 = (int)sVar12 + -1;
    sVar17 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::size((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&__range2);
    local_ee8 = (int)sVar17;
    if ((local_ee8 < 1) || (local_ee8 == local_ee4)) {
      if (0 < local_ee8) {
        ValidationState_t::RegisterStructTypeWithBuiltInMember
                  ((ValidationState_t *)inst_local,member_type_index._4_4_);
      }
      local_10d0._ = (ValidationState_t *)inst_local;
      psVar14 = ValidationState_t::context((ValidationState_t *)inst_local);
      bVar4 = spvIsVulkanEnv(psVar14->target_env);
      local_10f1 = 0;
      local_13a9 = false;
      if (bVar4) {
        psVar18 = ValidationState_t::options((ValidationState_t *)inst_local);
        pIVar15 = inst_local;
        local_13a9 = false;
        if ((psVar18->before_hlsl_legalization & 1U) == 0) {
          uVar6 = Instruction::id(pIStack_20);
          std::function<bool(spvtools::val::Instruction_const*)>::
          function<spvtools::val::(anonymous_namespace)::ValidateTypeStruct(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0_const&,void>
                    ((function<bool(spvtools::val::Instruction_const*)> *)&local_10f0,&local_10d0);
          local_10f1 = 1;
          local_13a9 = ValidationState_t::ContainsType
                                 ((ValidationState_t *)pIVar15,uVar6,&local_10f0,true);
        }
      }
      if ((local_10f1 & 1) != 0) {
        std::function<bool_(const_spvtools::val::Instruction_*)>::~function(&local_10f0);
      }
      if (local_13a9 == false) {
        __local._4_4_ = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag
                  (&local_12d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_12f0,(ValidationState_t *)inst_local,0x123b,(char *)0x0);
        pDVar13 = DiagnosticStream::operator<<(&local_12d0,&local_12f0);
        pDVar13 = DiagnosticStream::operator<<(pDVar13,(char (*) [4])0x6300a7);
        psVar14 = ValidationState_t::context((ValidationState_t *)inst_local);
        spvLogStringForEnv_abi_cxx11_(&local_1310,psVar14->target_env);
        pDVar13 = DiagnosticStream::operator<<(pDVar13,&local_1310);
        pDVar13 = DiagnosticStream::operator<<
                            (pDVar13,(char (*) [48])
                                     ", OpTypeStruct must not contain an opaque type.");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
        std::__cxx11::string::~string((string *)&local_1310);
        std::__cxx11::string::~string((string *)&local_12f0);
        DiagnosticStream::~DiagnosticStream(&local_12d0);
      }
    }
    else {
      ValidationState_t::diag
                (&local_10c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar13 = DiagnosticStream::operator<<
                          (&local_10c0,
                           (char (*) [64])
                           "When BuiltIn decoration is applied to a structure-type member, ");
      pDVar13 = DiagnosticStream::operator<<
                          (pDVar13,(char (*) [64])
                                   "all members of that structure type must also be decorated with "
                          );
      pDVar13 = DiagnosticStream::operator<<
                          (pDVar13,(char (*) [54])
                                   "BuiltIn (No allowed mixing of built-in variables and ");
      pDVar13 = DiagnosticStream::operator<<
                          (pDVar13,(char (*) [65])
                                   "non-built-in variables within a single structure). Structure id "
                          );
      pDVar13 = DiagnosticStream::operator<<(pDVar13,(uint *)((long)&member_type_index + 4));
      pDVar13 = DiagnosticStream::operator<<
                          (pDVar13,(char (*) [33])" does not meet this requirement.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar13);
      DiagnosticStream::~DiagnosticStream(&local_10c0);
    }
    isOpaqueType._._4_4_ = 1;
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&__range2);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypeStruct(ValidationState_t& _, const Instruction* inst) {
  const uint32_t struct_id = inst->GetOperandAs<uint32_t>(0);
  for (size_t member_type_index = 1;
       member_type_index < inst->operands().size(); ++member_type_index) {
    auto member_type_id = inst->GetOperandAs<uint32_t>(member_type_index);
    if (member_type_id == inst->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Structure members may not be self references";
    }

    auto member_type = _.FindDef(member_type_id);
    if (!member_type || !spvOpcodeGeneratesType(member_type->opcode())) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpTypeStruct Member Type <id> " << _.getIdName(member_type_id)
             << " is not a type.";
    }
    if (member_type->opcode() == spv::Op::OpTypeVoid) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Structures cannot contain a void type.";
    }
    if (spv::Op::OpTypeStruct == member_type->opcode() &&
        _.IsStructTypeWithBuiltInMember(member_type_id)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Structure <id> " << _.getIdName(member_type_id)
             << " contains members with BuiltIn decoration. Therefore this "
             << "structure may not be contained as a member of another "
             << "structure "
             << "type. Structure <id> " << _.getIdName(struct_id)
             << " contains structure <id> " << _.getIdName(member_type_id)
             << ".";
    }

    if (spvIsVulkanEnv(_.context()->target_env) &&
        member_type->opcode() == spv::Op::OpTypeRuntimeArray) {
      const bool is_last_member =
          member_type_index == inst->operands().size() - 1;
      if (!is_last_member) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << _.VkErrorID(4680) << "In "
               << spvLogStringForEnv(_.context()->target_env)
               << ", OpTypeRuntimeArray must only be used for the last member "
                  "of an OpTypeStruct";
      }

      if (!_.HasDecoration(inst->id(), spv::Decoration::Block) &&
          !_.HasDecoration(inst->id(), spv::Decoration::BufferBlock)) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << _.VkErrorID(4680)
               << spvLogStringForEnv(_.context()->target_env)
               << ", OpTypeStruct containing an OpTypeRuntimeArray "
               << "must be decorated with Block or BufferBlock.";
      }
    }
  }

  bool has_nested_blockOrBufferBlock_struct = false;
  // Struct members start at word 2 of OpTypeStruct instruction.
  for (size_t word_i = 2; word_i < inst->words().size(); ++word_i) {
    auto member = inst->word(word_i);
    auto memberTypeInstr = _.FindDef(member);
    if (memberTypeInstr && spv::Op::OpTypeStruct == memberTypeInstr->opcode()) {
      if (_.HasDecoration(memberTypeInstr->id(), spv::Decoration::Block) ||
          _.HasDecoration(memberTypeInstr->id(),
                          spv::Decoration::BufferBlock) ||
          _.GetHasNestedBlockOrBufferBlockStruct(memberTypeInstr->id()))
        has_nested_blockOrBufferBlock_struct = true;
    }
  }

  _.SetHasNestedBlockOrBufferBlockStruct(inst->id(),
                                         has_nested_blockOrBufferBlock_struct);
  if (_.GetHasNestedBlockOrBufferBlockStruct(inst->id()) &&
      (_.HasDecoration(inst->id(), spv::Decoration::BufferBlock) ||
       _.HasDecoration(inst->id(), spv::Decoration::Block))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "rules: A Block or BufferBlock cannot be nested within another "
              "Block or BufferBlock. ";
  }

  std::unordered_set<uint32_t> built_in_members;
  for (auto decoration : _.id_decorations(struct_id)) {
    if (decoration.dec_type() == spv::Decoration::BuiltIn &&
        decoration.struct_member_index() != Decoration::kInvalidMember) {
      built_in_members.insert(decoration.struct_member_index());
    }
  }
  int num_struct_members = static_cast<int>(inst->operands().size() - 1);
  int num_builtin_members = static_cast<int>(built_in_members.size());
  if (num_builtin_members > 0 && num_builtin_members != num_struct_members) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "When BuiltIn decoration is applied to a structure-type member, "
           << "all members of that structure type must also be decorated with "
           << "BuiltIn (No allowed mixing of built-in variables and "
           << "non-built-in variables within a single structure). Structure id "
           << struct_id << " does not meet this requirement.";
  }
  if (num_builtin_members > 0) {
    _.RegisterStructTypeWithBuiltInMember(struct_id);
  }

  const auto isOpaqueType = [&_](const Instruction* opaque_inst) {
    auto opcode = opaque_inst->opcode();
    if (_.HasCapability(spv::Capability::BindlessTextureNV) &&
        (opcode == spv::Op::OpTypeImage || opcode == spv::Op::OpTypeSampler ||
         opcode == spv::Op::OpTypeSampledImage)) {
      return false;
    } else if (spvOpcodeIsBaseOpaqueType(opcode)) {
      return true;
    }
    return false;
  };

  if (spvIsVulkanEnv(_.context()->target_env) &&
      !_.options()->before_hlsl_legalization &&
      _.ContainsType(inst->id(), isOpaqueType)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << _.VkErrorID(4667) << "In "
           << spvLogStringForEnv(_.context()->target_env)
           << ", OpTypeStruct must not contain an opaque type.";
  }

  return SPV_SUCCESS;
}